

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compress_fragment.c
# Opt level: O1

void BrotliCompressFragmentFastImpl9
               (MemoryManager *m,uint8_t *input,size_t input_size,int is_last,int *table,
               uint8_t *cmd_depth,uint16_t *cmd_bits,size_t *cmd_code_numbits,uint8_t *cmd_code,
               size_t *storage_ix,uint8_t *storage)

{
  dword *pdVar1;
  long *end;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  uint8_t *puVar5;
  long *plVar6;
  int *piVar7;
  byte bVar8;
  bool bVar9;
  byte bVar10;
  ulong uVar11;
  size_t storage_ix_start;
  uint uVar12;
  ulong uVar13;
  int iVar14;
  ulong uVar15;
  int iVar16;
  int iVar17;
  long *plVar18;
  long lVar19;
  ulong uVar20;
  uint8_t *puVar21;
  long *plVar22;
  char *pcVar24;
  ulong uVar25;
  ulong uVar26;
  long *plVar27;
  size_t *psVar28;
  Elf64_Ehdr *len;
  uint32_t cmd_histo [128];
  uint8_t lit_depth [256];
  uint16_t lit_bits [256];
  long *local_5d0;
  Elf64_Ehdr *local_5c8;
  long *local_5a8;
  Elf64_Ehdr *local_598;
  ulong local_588;
  long *local_580;
  ulong local_570;
  int local_548 [23];
  int aiStack_4ec [11];
  int aiStack_4c0 [9];
  int local_49c;
  int aiStack_498 [21];
  int local_444;
  int local_440;
  int local_43c;
  int local_438;
  int aiStack_3f8 [48];
  byte local_338 [256];
  uint16_t local_238 [260];
  dword *pdVar23;
  
  len = (Elf64_Ehdr *)0x18000;
  if (input_size < 0x18000) {
    len = (Elf64_Ehdr *)input_size;
  }
  storage_ix_start = *storage_ix;
  BrotliStoreMetaBlockHeader((size_t)len,0,storage_ix,storage);
  uVar13 = *storage_ix;
  uVar11 = uVar13 >> 3;
  *(ulong *)(storage + uVar11) = (ulong)storage[uVar11];
  *storage_ix = uVar13 + 0xd;
  local_570 = BuildAndStoreLiteralPrefixCode
                        (m,input,(size_t)len,local_338,local_238,storage_ix,storage);
  uVar13 = *cmd_code_numbits;
  if (7 < uVar13) {
    uVar11 = 0;
    do {
      uVar13 = *storage_ix;
      *(ulong *)(storage + (uVar13 >> 3)) =
           (ulong)cmd_code[uVar11 >> 3] << ((byte)uVar13 & 7) | (ulong)storage[uVar13 >> 3];
      *storage_ix = uVar13 + 8;
      uVar13 = *cmd_code_numbits;
      uVar4 = uVar11 + 0xf;
      uVar11 = uVar11 + 8;
    } while (uVar4 < uVar13);
  }
  uVar11 = *storage_ix;
  *(ulong *)(storage + (uVar11 >> 3)) =
       (ulong)cmd_code[uVar13 >> 3] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
  *storage_ix = ((uint)uVar13 & 7) + uVar11;
  plVar6 = (long *)input;
  psVar28 = cmd_code_numbits;
  local_5c8 = (Elf64_Ehdr *)input_size;
  local_580 = (long *)input;
LAB_0011fa03:
  local_5a8 = local_580;
  local_5d0 = plVar6;
  local_598 = len;
LAB_0011fa1e:
  memcpy(local_548 + 4,kCmdHistoSeed,0x200);
  end = (long *)((long)local_5a8 + (long)len);
  if ((Elf64_Ehdr *)0xf < len) {
    pdVar1 = (dword *)((long)&len[-1].e_shentsize + 1);
    pdVar23 = &local_5c8[-1].e_flags;
    if (pdVar1 < &local_5c8[-1].e_flags) {
      pdVar23 = pdVar1;
    }
    plVar22 = (long *)((long)pdVar23 + (long)local_5a8);
    plVar6 = (long *)((long)local_5a8 + 1);
    uVar13 = (ulong)(*(long *)((long)local_5a8 + 1) * 0x1e35a7bd000000) >> 0x37;
    iVar3 = -1;
LAB_0011fa9b:
    uVar12 = 0x20;
    plVar27 = plVar6;
    do {
      plVar18 = (long *)((ulong)(uVar12 >> 5) + (long)plVar27);
      iVar14 = (int)input;
      if (plVar22 < plVar18) {
        iVar17 = 0xb;
      }
      else {
        uVar11 = (ulong)(*plVar18 * 0x1e35a7bd000000) >> 0x37;
        if ((((int)*plVar27 == *(int *)((long)plVar27 + -(long)iVar3)) &&
            (psVar28 = (size_t *)(-(long)iVar3 + (long)plVar27),
            *(char *)((long)plVar27 + 4) == *(char *)((long)psVar28 + 4))) && (0 < iVar3)) {
          table[uVar13] = (int)plVar27 - iVar14;
          iVar17 = 9;
          uVar13 = uVar11;
        }
        else {
          psVar28 = (size_t *)(input + table[uVar13]);
          table[uVar13] = (int)plVar27 - iVar14;
          iVar17 = 0;
          uVar13 = uVar11;
        }
      }
      if (iVar17 == 9) {
LAB_0011fb27:
        if ((long)plVar27 - (long)psVar28 < 0x3fff1) goto LAB_0011fb51;
      }
      else {
        plVar6 = plVar27;
        if (iVar17 != 0) goto LAB_001208f5;
        if (((int)*plVar27 == (int)*psVar28) &&
           (*(char *)((long)plVar27 + 4) == *(char *)((long)psVar28 + 4))) goto LAB_0011fb27;
      }
      uVar12 = uVar12 + 1;
      plVar27 = plVar18;
    } while( true );
  }
  goto LAB_00120b19;
LAB_0011fb51:
  puVar5 = (uint8_t *)((long)end + (-5 - (long)plVar27));
  if ((uint8_t *)0x7 < puVar5) {
    local_588 = (ulong)puVar5 & 0xfffffffffffffff8;
    pcVar24 = (char *)((long)plVar27 + local_588 + 5);
    lVar19 = 0;
    uVar11 = 0;
LAB_0011fb8b:
    uVar4 = *(ulong *)((char *)((long)plVar27 + 5) + uVar11 * 8);
    uVar20 = *(ulong *)((long)psVar28 + uVar11 * 8 + 5);
    if (uVar4 == uVar20) goto code_r0x0011fb99;
    uVar20 = uVar20 ^ uVar4;
    uVar11 = 0;
    if (uVar20 != 0) {
      for (; (uVar20 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
      }
    }
    uVar11 = (uVar11 >> 3 & 0x1fffffff) - lVar19;
    goto LAB_0011fbd5;
  }
  local_588 = 0;
  pcVar24 = (char *)((long)plVar27 + 5);
LAB_0012090b:
  uVar4 = (ulong)puVar5 & 7;
  uVar11 = local_588;
  if (uVar4 != 0) {
    uVar20 = local_588 | uVar4;
    do {
      uVar11 = local_588;
      if (*(char *)((long)psVar28 + local_588 + 5) != *pcVar24) break;
      pcVar24 = pcVar24 + 1;
      local_588 = local_588 + 1;
      uVar4 = uVar4 - 1;
      uVar11 = uVar20;
    } while (uVar4 != 0);
  }
LAB_0011fbd5:
  uVar4 = (long)plVar27 - (long)local_5d0;
  plVar6 = (long *)((long)plVar27 + uVar11 + 5);
  if (uVar4 < 0x1842) {
    if (uVar4 < 6) {
      bVar10 = cmd_depth[uVar4 + 0x28];
      uVar20 = *storage_ix;
      *(ulong *)(storage + (uVar20 >> 3)) =
           (ulong)cmd_bits[uVar4 + 0x28] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
      *storage_ix = bVar10 + uVar20;
      aiStack_498[uVar4] = aiStack_498[uVar4] + 1;
    }
    else if (uVar4 < 0x82) {
      uVar20 = uVar4 - 2;
      uVar12 = 0x1f;
      if ((uint)uVar20 != 0) {
        for (; (uint)uVar20 >> uVar12 == 0; uVar12 = uVar12 - 1) {
        }
      }
      uVar2 = (uVar12 ^ 0xffffffe0) + 0x1f;
      bVar10 = (byte)uVar2;
      uVar25 = uVar20 >> (bVar10 & 0x3f);
      lVar19 = ((uVar12 ^ 0xffffffe0) * 2 + 0x3e) + uVar25;
      uVar15 = *storage_ix;
      uVar26 = cmd_depth[lVar19 + 0x2a] + uVar15;
      *(ulong *)(storage + (uVar15 >> 3)) =
           (ulong)cmd_bits[lVar19 + 0x2a] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      *storage_ix = uVar26;
      *(ulong *)(storage + (uVar26 >> 3)) =
           uVar20 - (uVar25 << (bVar10 & 0x3f)) << ((byte)uVar26 & 7) | (ulong)storage[uVar26 >> 3];
      *storage_ix = uVar26 + uVar2;
      aiStack_498[lVar19 + 2] = aiStack_498[lVar19 + 2] + 1;
    }
    else if (uVar4 < 0x842) {
      uVar2 = (int)uVar4 - 0x42;
      uVar12 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar12 == 0; uVar12 = uVar12 - 1) {
        }
      }
      lVar19 = -(ulong)(uVar12 ^ 0x1f) + 0x51;
      uVar20 = *storage_ix;
      uVar15 = cmd_depth[lVar19] + uVar20;
      *(ulong *)(storage + (uVar20 >> 3)) =
           (ulong)cmd_bits[lVar19] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
      *storage_ix = uVar15;
      *(ulong *)(storage + (uVar15 >> 3)) =
           (-1L << ((byte)uVar12 & 0x3f)) + uVar4 + -0x42 << ((byte)uVar15 & 7) |
           (ulong)storage[uVar15 >> 3];
      *storage_ix = uVar12 + uVar15;
      local_548[-(ulong)(uVar12 ^ 0x1f) + 0x55] = local_548[-(ulong)(uVar12 ^ 0x1f) + 0x55] + 1;
    }
    else {
      bVar10 = cmd_depth[0x3d];
      uVar15 = *storage_ix;
      uVar20 = uVar15 + bVar10;
      *(ulong *)(storage + (uVar15 >> 3)) =
           (ulong)cmd_bits[0x3d] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      *storage_ix = uVar20;
      *(ulong *)(storage + (uVar20 >> 3)) =
           uVar4 - 0x842 << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
      *storage_ix = uVar15 + bVar10 + 0xc;
      local_444 = local_444 + 1;
    }
  }
  else {
    uVar20 = ((long)local_5d0 - (long)local_580) * 0x32;
    if ((uVar20 < uVar4 || uVar20 - uVar4 == 0) && (0x3d4 < local_570)) {
      EmitUncompressedMetaBlock
                ((uint8_t *)local_580,(uint8_t *)plVar27,storage_ix_start,storage_ix,storage);
      local_5c8 = (Elf64_Ehdr *)
                  ((long)local_5a8 + (long)(local_5c8->e_ident_magic_str + (-1 - (long)plVar27)));
      iVar17 = 0xc;
      bVar9 = false;
      local_5a8 = plVar27;
      goto LAB_00120400;
    }
    if (uVar4 < 0x5842) {
      bVar10 = cmd_depth[0x3e];
      uVar15 = *storage_ix;
      uVar20 = uVar15 + bVar10;
      *(ulong *)(storage + (uVar15 >> 3)) =
           (ulong)cmd_bits[0x3e] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      *storage_ix = uVar20;
      *(ulong *)(storage + (uVar20 >> 3)) =
           uVar4 - 0x1842 << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
      *storage_ix = uVar15 + bVar10 + 0xe;
      local_440 = local_440 + 1;
    }
    else {
      bVar10 = cmd_depth[0x3f];
      uVar15 = *storage_ix;
      uVar20 = uVar15 + bVar10;
      *(ulong *)(storage + (uVar15 >> 3)) =
           (ulong)cmd_bits[0x3f] << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
      *storage_ix = uVar20;
      *(ulong *)(storage + (uVar20 >> 3)) =
           uVar4 - 0x5842 << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
      *storage_ix = uVar15 + bVar10 + 0x18;
      local_43c = local_43c + 1;
    }
  }
  if (plVar27 != local_5d0) {
    uVar20 = *storage_ix;
    lVar19 = 0;
    do {
      bVar10 = local_338[*(byte *)((long)local_5d0 + lVar19)];
      *(ulong *)(storage + (uVar20 >> 3)) =
           (ulong)local_238[*(byte *)((long)local_5d0 + lVar19)] << ((byte)uVar20 & 7) |
           (ulong)storage[uVar20 >> 3];
      uVar20 = uVar20 + bVar10;
      *storage_ix = uVar20;
      lVar19 = lVar19 + 1;
    } while (uVar4 + (uVar4 == 0) != lVar19);
  }
  iVar17 = (int)((long)plVar27 - (long)psVar28);
  if (iVar3 == iVar17) {
    bVar10 = cmd_depth[0x40];
    uVar4 = *storage_ix;
    *(ulong *)(storage + (uVar4 >> 3)) =
         (ulong)cmd_bits[0x40] << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
    *storage_ix = bVar10 + uVar4;
    local_438 = local_438 + 1;
  }
  else {
    uVar4 = (long)iVar17 + 3;
    uVar12 = 0x1f;
    if ((uint)uVar4 != 0) {
      for (; (uint)uVar4 >> uVar12 == 0; uVar12 = uVar12 - 1) {
      }
    }
    uVar2 = 0x1e - (uVar12 ^ 0x1f);
    uVar15 = (ulong)((uVar4 >> ((ulong)uVar2 & 0x3f) & 1) != 0);
    uVar26 = ((uVar12 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar15;
    uVar20 = *storage_ix;
    uVar25 = cmd_depth[uVar26 + 0x50] + uVar20;
    *(ulong *)(storage + (uVar20 >> 3)) =
         (ulong)cmd_bits[uVar26 + 0x50] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
    *storage_ix = uVar25;
    *(ulong *)(storage + (uVar25 >> 3)) =
         uVar4 - (uVar15 + 2 << ((byte)uVar2 & 0x3f)) << ((byte)uVar25 & 7) |
         (ulong)storage[uVar25 >> 3];
    *storage_ix = uVar25 + uVar2;
    aiStack_3f8[uVar26] = aiStack_3f8[uVar26] + 1;
    iVar3 = iVar17;
  }
  uVar4 = uVar11 + 5;
  if (uVar4 < 0xc) {
    bVar10 = cmd_depth[uVar11 + 1];
    uVar4 = *storage_ix;
    *(ulong *)(storage + (uVar4 >> 3)) =
         (ulong)cmd_bits[uVar11 + 1] << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
    *storage_ix = bVar10 + uVar4;
    local_548[uVar11 + 5] = local_548[uVar11 + 5] + 1;
  }
  else if (uVar4 < 0x48) {
    uVar4 = uVar11 - 3;
    uVar12 = 0x1f;
    if ((uint)uVar4 != 0) {
      for (; (uint)uVar4 >> uVar12 == 0; uVar12 = uVar12 - 1) {
      }
    }
    uVar2 = (uVar12 ^ 0xffffffe0) + 0x1f;
    bVar10 = (byte)uVar2;
    uVar26 = uVar4 >> (bVar10 & 0x3f);
    lVar19 = ((uVar12 ^ 0xffffffe0) * 2 + 0x3e) + uVar26;
    uVar20 = *storage_ix;
    uVar15 = cmd_depth[lVar19 + 4] + uVar20;
    *(ulong *)(storage + (uVar20 >> 3)) =
         (ulong)cmd_bits[lVar19 + 4] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
    *storage_ix = uVar15;
    *(ulong *)(storage + (uVar15 >> 3)) =
         uVar4 - (uVar26 << (bVar10 & 0x3f)) << ((byte)uVar15 & 7) | (ulong)storage[uVar15 >> 3];
    *storage_ix = uVar15 + uVar2;
    local_548[lVar19 + 8] = local_548[lVar19 + 8] + 1;
  }
  else if (uVar4 < 0x88) {
    uVar15 = uVar11 - 3 >> 5;
    uVar20 = *storage_ix;
    uVar4 = uVar20 + cmd_depth[uVar15 + 0x1e];
    uVar26 = uVar20 + cmd_depth[uVar15 + 0x1e] + 5;
    *(ulong *)(storage + (uVar20 >> 3)) =
         (ulong)cmd_bits[uVar15 + 0x1e] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
    *storage_ix = uVar4;
    *(ulong *)(storage + (uVar4 >> 3)) =
         (ulong)((uint)(uVar11 - 3) & 0x1f) << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
    *storage_ix = uVar26;
    bVar10 = cmd_depth[0x40];
    *(ulong *)(storage + (uVar26 >> 3)) =
         (ulong)cmd_bits[0x40] << ((byte)uVar26 & 7) | (ulong)storage[uVar26 >> 3];
    *storage_ix = bVar10 + uVar4 + 5;
    aiStack_4c0[uVar15] = aiStack_4c0[uVar15] + 1;
    local_438 = local_438 + 1;
  }
  else {
    if (uVar4 < 0x848) {
      uVar2 = (int)uVar11 - 0x43;
      uVar12 = 0x1f;
      if (uVar2 != 0) {
        for (; uVar2 >> uVar12 == 0; uVar12 = uVar12 - 1) {
        }
      }
      lVar19 = -(ulong)(uVar12 ^ 0x1f) + 0x3b;
      uVar4 = *storage_ix;
      uVar20 = cmd_depth[lVar19] + uVar4;
      *(ulong *)(storage + (uVar4 >> 3)) =
           (ulong)cmd_bits[lVar19] << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
      *storage_ix = uVar20;
      uVar4 = uVar12 + uVar20;
      *(ulong *)(storage + (uVar20 >> 3)) =
           (-1L << ((byte)uVar12 & 0x3f)) + uVar11 + -0x43 << ((byte)uVar20 & 7) |
           (ulong)storage[uVar20 >> 3];
      *storage_ix = uVar4;
      bVar10 = cmd_depth[0x40];
      *(ulong *)(storage + (uVar4 >> 3)) =
           (ulong)cmd_bits[0x40] << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
      *storage_ix = bVar10 + uVar4;
      local_548[-(ulong)(uVar12 ^ 0x1f) + 0x3f] = local_548[-(ulong)(uVar12 ^ 0x1f) + 0x3f] + 1;
    }
    else {
      uVar20 = *storage_ix;
      uVar4 = uVar20 + cmd_depth[0x27];
      uVar15 = uVar20 + cmd_depth[0x27] + 0x18;
      *(ulong *)(storage + (uVar20 >> 3)) =
           (ulong)cmd_bits[0x27] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
      *storage_ix = uVar4;
      bVar8 = (byte)uVar4 & 7;
      *(ulong *)(storage + (uVar4 >> 3)) = uVar11 - 0x843 << bVar8 | (ulong)storage[uVar4 >> 3];
      *storage_ix = uVar15;
      bVar10 = cmd_depth[0x40];
      uVar15 = uVar15 >> 3;
      *(ulong *)(storage + uVar15) = (ulong)cmd_bits[0x40] << bVar8 | (ulong)storage[uVar15];
      *storage_ix = bVar10 + uVar4 + 0x18;
      local_49c = local_49c + 1;
    }
    local_438 = local_438 + 1;
  }
  iVar17 = 0;
  if (plVar22 <= plVar6) {
    iVar17 = 0xb;
  }
  else {
    uVar11 = *(ulong *)((long)plVar27 + uVar11 + 2);
    uVar4 = (uVar11 >> 0x18) * 0x1e35a7bd000000 >> 0x37;
    iVar16 = (int)plVar6 - iVar14;
    table[uVar11 * 0x1e35a7bd000000 >> 0x37] = iVar16 + -3;
    table[(uVar11 >> 8) * 0x1e35a7bd000000 >> 0x37] = iVar16 + -2;
    table[(uVar11 >> 0x10) * 0x1e35a7bd000000 >> 0x37] = iVar16 + -1;
    psVar28 = (size_t *)(input + table[uVar4]);
    table[uVar4] = iVar16;
  }
  bVar9 = plVar22 > plVar6;
  plVar27 = plVar6;
LAB_00120400:
  plVar18 = plVar6;
  local_5d0 = plVar27;
  if (bVar9) {
    do {
      plVar6 = plVar18;
      if (((int)*plVar18 != (int)*psVar28) ||
         (*(uint8_t *)((long)plVar18 + 4) != *(uint8_t *)((long)psVar28 + 4))) goto LAB_001208df;
      puVar5 = (uint8_t *)((long)end + (-5 - (long)plVar18));
      if ((uint8_t *)0x7 < puVar5) {
        uVar11 = (ulong)puVar5 & 0xfffffffffffffff8;
        puVar21 = (uint8_t *)((long)plVar18 + uVar11 + 5);
        lVar19 = 0;
        uVar4 = 0;
LAB_00120467:
        uVar20 = *(ulong *)((uint8_t *)((long)plVar18 + 5) + uVar4 * 8);
        uVar15 = *(ulong *)((long)psVar28 + uVar4 * 8 + 5);
        if (uVar20 == uVar15) goto code_r0x00120475;
        uVar15 = uVar15 ^ uVar20;
        uVar11 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> uVar11 & 1) == 0; uVar11 = uVar11 + 1) {
          }
        }
        uVar4 = (uVar11 >> 3 & 0x1fffffff) - lVar19;
        goto LAB_001204e1;
      }
      uVar11 = 0;
      puVar21 = (uint8_t *)((long)plVar18 + 5);
LAB_00120885:
      uVar20 = (ulong)puVar5 & 7;
      uVar4 = uVar11;
      if (uVar20 != 0) {
        uVar15 = uVar11 | uVar20;
        do {
          uVar4 = uVar11;
          if (*(uint8_t *)((long)psVar28 + uVar11 + 5) != *puVar21) break;
          puVar21 = puVar21 + 1;
          uVar11 = uVar11 + 1;
          uVar20 = uVar20 - 1;
          uVar4 = uVar15;
        } while (uVar20 != 0);
      }
LAB_001204e1:
      iVar17 = 0xe;
      if ((long)plVar18 - (long)psVar28 < 0x3fff1) {
        uVar11 = uVar4 + 5;
        if (uVar11 < 10) {
          bVar10 = cmd_depth[uVar4 + 0x13];
          uVar11 = *storage_ix;
          *(ulong *)(storage + (uVar11 >> 3)) =
               (ulong)cmd_bits[uVar4 + 0x13] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
          *storage_ix = bVar10 + uVar11;
          piVar7 = aiStack_4ec + uVar4;
        }
        else if (uVar11 < 0x86) {
          uVar11 = uVar4 - 1;
          uVar12 = 0x1f;
          if ((uint)uVar11 != 0) {
            for (; (uint)uVar11 >> uVar12 == 0; uVar12 = uVar12 - 1) {
            }
          }
          uVar2 = (uVar12 ^ 0xffffffe0) + 0x1f;
          bVar10 = (byte)uVar2;
          uVar26 = uVar11 >> (bVar10 & 0x3f);
          lVar19 = ((uVar12 ^ 0xffffffe0) * 2 + 0x3e) + uVar26;
          uVar20 = *storage_ix;
          uVar15 = cmd_depth[lVar19 + 0x14] + uVar20;
          *(ulong *)(storage + (uVar20 >> 3)) =
               (ulong)cmd_bits[lVar19 + 0x14] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
          *storage_ix = uVar15;
          *(ulong *)(storage + (uVar15 >> 3)) =
               uVar11 - (uVar26 << (bVar10 & 0x3f)) << ((byte)uVar15 & 7) |
               (ulong)storage[uVar15 >> 3];
          *storage_ix = uVar15 + uVar2;
          piVar7 = aiStack_4ec + lVar19 + 1;
        }
        else if (uVar11 < 0x846) {
          uVar2 = (int)uVar4 - 0x41;
          uVar12 = 0x1f;
          if (uVar2 != 0) {
            for (; uVar2 >> uVar12 == 0; uVar12 = uVar12 - 1) {
            }
          }
          lVar19 = -(ulong)(uVar12 ^ 0x1f) + 0x3b;
          uVar11 = *storage_ix;
          uVar20 = cmd_depth[lVar19] + uVar11;
          *(ulong *)(storage + (uVar11 >> 3)) =
               (ulong)cmd_bits[lVar19] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
          *storage_ix = uVar20;
          *(ulong *)(storage + (uVar20 >> 3)) =
               (-1L << ((byte)uVar12 & 0x3f)) + uVar4 + -0x41 << ((byte)uVar20 & 7) |
               (ulong)storage[uVar20 >> 3];
          *storage_ix = uVar12 + uVar20;
          piVar7 = local_548 + -(ulong)(uVar12 ^ 0x1f) + 0x3f;
        }
        else {
          bVar10 = cmd_depth[0x27];
          uVar20 = *storage_ix;
          uVar11 = uVar20 + bVar10;
          *(ulong *)(storage + (uVar20 >> 3)) =
               (ulong)cmd_bits[0x27] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
          *storage_ix = uVar11;
          *(ulong *)(storage + (uVar11 >> 3)) =
               uVar4 - 0x841 << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
          *storage_ix = bVar10 + uVar20 + 0x18;
          piVar7 = &local_49c;
        }
        *piVar7 = *piVar7 + 1;
        iVar3 = (int)((long)plVar18 - (long)psVar28);
        uVar11 = (long)iVar3 + 3;
        uVar12 = 0x1f;
        if ((uint)uVar11 != 0) {
          for (; (uint)uVar11 >> uVar12 == 0; uVar12 = uVar12 - 1) {
          }
        }
        uVar2 = 0x1e - (uVar12 ^ 0x1f);
        uVar26 = (ulong)((uVar11 >> ((ulong)uVar2 & 0x3f) & 1) != 0);
        uVar15 = ((uVar12 ^ 0x1f) * 2 ^ 0x3e) - 4 | uVar26;
        uVar20 = *storage_ix;
        bVar10 = cmd_depth[uVar15 + 0x50];
        *(ulong *)(storage + (uVar20 >> 3)) =
             (ulong)cmd_bits[uVar15 + 0x50] << ((byte)uVar20 & 7) | (ulong)storage[uVar20 >> 3];
        uVar20 = bVar10 + uVar20;
        *storage_ix = uVar20;
        *(ulong *)(storage + (uVar20 >> 3)) =
             uVar11 - (uVar26 + 2 << ((byte)uVar2 & 0x3f)) << ((byte)uVar20 & 7) |
             (ulong)storage[uVar20 >> 3];
        plVar6 = (long *)((long)plVar18 + uVar4 + 5);
        *storage_ix = uVar20 + uVar2;
        aiStack_3f8[uVar15] = aiStack_3f8[uVar15] + 1;
        plVar27 = plVar6;
        if (plVar6 < plVar22) {
          uVar11 = *(ulong *)((long)plVar18 + uVar4 + 2);
          uVar4 = (uVar11 >> 0x18) * 0x1e35a7bd000000 >> 0x37;
          iVar17 = (int)plVar6 - iVar14;
          table[uVar11 * 0x1e35a7bd000000 >> 0x37] = iVar17 + -3;
          table[(uVar11 >> 8) * 0x1e35a7bd000000 >> 0x37] = iVar17 + -2;
          table[(uVar11 >> 0x10) * 0x1e35a7bd000000 >> 0x37] = iVar17 + -1;
          psVar28 = (size_t *)(input + table[uVar4]);
          table[uVar4] = iVar17;
          iVar17 = 0;
        }
        else {
          iVar17 = 0xb;
        }
      }
      plVar18 = plVar6;
    } while (iVar17 == 0);
    local_5d0 = plVar27;
    if (iVar17 == 0xe) {
LAB_001208df:
      plVar18 = (long *)((long)plVar6 + 1);
      plVar6 = (long *)((long)plVar6 + 1);
      uVar13 = (ulong)(*plVar18 * 0x1e35a7bd000000) >> 0x37;
      iVar17 = 0;
      local_5d0 = plVar27;
    }
  }
LAB_001208f5:
  if (iVar17 != 0) goto LAB_00120af1;
  goto LAB_0011fa9b;
code_r0x0011fb99:
  uVar11 = uVar11 + 1;
  lVar19 = lVar19 + -8;
  if ((ulong)puVar5 >> 3 == uVar11) goto LAB_0012090b;
  goto LAB_0011fb8b;
code_r0x00120475:
  uVar4 = uVar4 + 1;
  lVar19 = lVar19 + -8;
  if ((ulong)puVar5 >> 3 == uVar4) goto LAB_00120885;
  goto LAB_00120467;
LAB_00120af1:
  plVar6 = local_5d0;
  if (iVar17 == 0xc) goto LAB_00120baf;
LAB_00120b19:
  local_5a8 = (long *)((long)local_5a8 + (long)len);
  local_5c8 = (Elf64_Ehdr *)((long)local_5c8 - (long)len);
  len = (Elf64_Ehdr *)0x10000;
  if (local_5c8 < (Elf64_Ehdr *)0x10000) {
    len = local_5c8;
  }
  if (((local_5c8 == (Elf64_Ehdr *)0x0) ||
      (local_598 = (Elf64_Ehdr *)
                   (len->e_ident_magic_str + (long)(local_598->e_ident_magic_str + -2)),
      &Elf64_Ehdr_00100000 < local_598)) ||
     (iVar3 = ShouldMergeBlock((uint8_t *)local_5a8,(size_t)len,local_338), iVar3 == 0))
  goto LAB_00120c8a;
  UpdateBits((ulong)((int)local_598 - 1),(int)storage_ix_start + 3,(size_t)storage,
             (uint8_t *)local_598);
  goto LAB_0011fa1e;
LAB_00120c8a:
  plVar6 = end;
  if (local_5d0 < end) {
    uVar13 = (long)end - (long)local_5d0;
    if (uVar13 < 0x1842) {
      if (uVar13 < 6) {
        bVar10 = cmd_depth[uVar13 + 0x28];
        uVar11 = *storage_ix;
        *(ulong *)(storage + (uVar11 >> 3)) =
             (ulong)cmd_bits[uVar13 + 0x28] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
        *storage_ix = bVar10 + uVar11;
        piVar7 = aiStack_498 + uVar13;
      }
      else if (uVar13 < 0x82) {
        uVar11 = uVar13 - 2;
        uVar12 = 0x1f;
        if ((uint)uVar11 != 0) {
          for (; (uint)uVar11 >> uVar12 == 0; uVar12 = uVar12 - 1) {
          }
        }
        uVar2 = (uVar12 ^ 0xffffffe0) + 0x1f;
        bVar10 = (byte)uVar2;
        uVar15 = uVar11 >> (bVar10 & 0x3f);
        lVar19 = ((uVar12 ^ 0xffffffe0) * 2 + 0x3e) + uVar15;
        uVar4 = *storage_ix;
        uVar20 = cmd_depth[lVar19 + 0x2a] + uVar4;
        *(ulong *)(storage + (uVar4 >> 3)) =
             (ulong)cmd_bits[lVar19 + 0x2a] << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
        *storage_ix = uVar20;
        *(ulong *)(storage + (uVar20 >> 3)) =
             uVar11 - (uVar15 << (bVar10 & 0x3f)) << ((byte)uVar20 & 7) |
             (ulong)storage[uVar20 >> 3];
        *storage_ix = uVar20 + uVar2;
        piVar7 = aiStack_498 + lVar19 + 2;
      }
      else if (uVar13 < 0x842) {
        uVar2 = (int)uVar13 - 0x42;
        uVar12 = 0x1f;
        if (uVar2 != 0) {
          for (; uVar2 >> uVar12 == 0; uVar12 = uVar12 - 1) {
          }
        }
        lVar19 = -(ulong)(uVar12 ^ 0x1f) + 0x51;
        uVar11 = *storage_ix;
        uVar4 = cmd_depth[lVar19] + uVar11;
        *(ulong *)(storage + (uVar11 >> 3)) =
             (ulong)cmd_bits[lVar19] << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
        *storage_ix = uVar4;
        *(ulong *)(storage + (uVar4 >> 3)) =
             (-1L << ((byte)uVar12 & 0x3f)) + uVar13 + -0x42 << ((byte)uVar4 & 7) |
             (ulong)storage[uVar4 >> 3];
        *storage_ix = uVar12 + uVar4;
        piVar7 = local_548 + -(ulong)(uVar12 ^ 0x1f) + 0x55;
      }
      else {
        bVar10 = cmd_depth[0x3d];
        uVar4 = *storage_ix;
        uVar11 = uVar4 + bVar10;
        *(ulong *)(storage + (uVar4 >> 3)) =
             (ulong)cmd_bits[0x3d] << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
        *storage_ix = uVar11;
        *(ulong *)(storage + (uVar11 >> 3)) =
             uVar13 - 0x842 << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
        *storage_ix = bVar10 + uVar4 + 0xc;
        piVar7 = &local_444;
      }
      *piVar7 = *piVar7 + 1;
      if (end != local_5d0) {
        uVar11 = *storage_ix;
        lVar19 = 0;
        do {
          bVar10 = local_338[*(byte *)((long)local_5d0 + lVar19)];
          *(ulong *)(storage + (uVar11 >> 3)) =
               (ulong)local_238[*(byte *)((long)local_5d0 + lVar19)] << ((byte)uVar11 & 7) |
               (ulong)storage[uVar11 >> 3];
          uVar11 = uVar11 + bVar10;
          *storage_ix = uVar11;
          lVar19 = lVar19 + 1;
        } while (uVar13 + (uVar13 == 0) != lVar19);
      }
    }
    else {
      uVar11 = ((long)local_5d0 - (long)local_580) * 0x32;
      if ((uVar11 < uVar13 || uVar11 - uVar13 == 0) && (0x3d4 < local_570)) {
        EmitUncompressedMetaBlock
                  ((uint8_t *)local_580,(uint8_t *)end,storage_ix_start,storage_ix,storage);
      }
      else {
        if (uVar13 < 0x5842) {
          bVar10 = cmd_depth[0x3e];
          uVar4 = *storage_ix;
          uVar11 = uVar4 + bVar10;
          *(ulong *)(storage + (uVar4 >> 3)) =
               (ulong)cmd_bits[0x3e] << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
          *storage_ix = uVar11;
          *(ulong *)(storage + (uVar11 >> 3)) =
               uVar13 - 0x1842 << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
          *storage_ix = bVar10 + uVar4 + 0xe;
          local_440 = local_440 + 1;
        }
        else {
          bVar10 = cmd_depth[0x3f];
          uVar4 = *storage_ix;
          uVar11 = uVar4 + bVar10;
          *(ulong *)(storage + (uVar4 >> 3)) =
               (ulong)cmd_bits[0x3f] << ((byte)uVar4 & 7) | (ulong)storage[uVar4 >> 3];
          *storage_ix = uVar11;
          *(ulong *)(storage + (uVar11 >> 3)) =
               uVar13 - 0x5842 << ((byte)uVar11 & 7) | (ulong)storage[uVar11 >> 3];
          *storage_ix = bVar10 + uVar4 + 0x18;
          local_43c = local_43c + 1;
        }
        uVar11 = *storage_ix;
        lVar19 = 0;
        do {
          bVar10 = local_338[*(byte *)((long)local_5d0 + lVar19)];
          *(ulong *)(storage + (uVar11 >> 3)) =
               (ulong)local_238[*(byte *)((long)local_5d0 + lVar19)] << ((byte)uVar11 & 7) |
               (ulong)storage[uVar11 >> 3];
          uVar11 = uVar11 + bVar10;
          *storage_ix = uVar11;
          lVar19 = lVar19 + 1;
        } while (uVar13 + (uVar13 == 0) != lVar19);
      }
    }
  }
LAB_00120baf:
  if (local_5c8 == (Elf64_Ehdr *)0x0) {
    if (is_last == 0) {
      *cmd_code = '\0';
      *cmd_code_numbits = 0;
      BuildAndStoreCommandPrefixCode
                ((uint32_t *)(local_548 + 4),cmd_depth,cmd_bits,cmd_code_numbits,cmd_code);
    }
    return;
  }
  len = (Elf64_Ehdr *)0x18000;
  if (local_5c8 < (Elf64_Ehdr *)0x18000) {
    len = local_5c8;
  }
  storage_ix_start = *storage_ix;
  BrotliStoreMetaBlockHeader((size_t)len,0,storage_ix,storage);
  uVar13 = *storage_ix;
  uVar11 = uVar13 >> 3;
  *(ulong *)(storage + uVar11) = (ulong)storage[uVar11];
  *storage_ix = uVar13 + 0xd;
  local_570 = BuildAndStoreLiteralPrefixCode
                        (m,(uint8_t *)local_5a8,(size_t)len,local_338,local_238,storage_ix,storage);
  BuildAndStoreCommandPrefixCode((uint32_t *)(local_548 + 4),cmd_depth,cmd_bits,storage_ix,storage);
  local_580 = local_5a8;
  goto LAB_0011fa03;
}

Assistant:

void BrotliCompressFragmentFast(
    MemoryManager* m, const uint8_t* input, size_t input_size,
    BROTLI_BOOL is_last, int* table, size_t table_size, uint8_t cmd_depth[128],
    uint16_t cmd_bits[128], size_t* cmd_code_numbits, uint8_t* cmd_code,
    size_t* storage_ix, uint8_t* storage) {
  const size_t initial_storage_ix = *storage_ix;
  const size_t table_bits = Log2FloorNonZero(table_size);

  if (input_size == 0) {
    BROTLI_DCHECK(is_last);
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
    return;
  }

  switch (table_bits) {
#define CASE_(B)                                                     \
    case B:                                                          \
      BrotliCompressFragmentFastImpl ## B(                           \
          m, input, input_size, is_last, table, cmd_depth, cmd_bits, \
          cmd_code_numbits, cmd_code, storage_ix, storage);          \
      break;
    FOR_TABLE_BITS_(CASE_)
#undef CASE_
    default: BROTLI_DCHECK(0); break;
  }

  /* If output is larger than single uncompressed block, rewrite it. */
  if (*storage_ix - initial_storage_ix > 31 + (input_size << 3)) {
    EmitUncompressedMetaBlock(input, input + input_size, initial_storage_ix,
                              storage_ix, storage);
  }

  if (is_last) {
    BrotliWriteBits(1, 1, storage_ix, storage);  /* islast */
    BrotliWriteBits(1, 1, storage_ix, storage);  /* isempty */
    *storage_ix = (*storage_ix + 7u) & ~7u;
  }
}